

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMiMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  float fVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Geometry *pGVar9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  NodeRef *pNVar20;
  AABBNodeMB4D *node1;
  ulong uVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  uint uVar26;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  size_t sVar39;
  ulong uVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  uint uVar64;
  uint uVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  NodeRef *local_a78;
  float old_t;
  undefined1 local_9f8 [16];
  Geometry *local_9e0;
  ulong local_9d8;
  ulong local_9d0;
  NodeRef *local_9c8;
  Scene *scene;
  ulong local_9b8;
  long local_9b0;
  RTCFilterFunctionNArguments args;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined1 local_918 [16];
  undefined1 local_908 [16];
  undefined1 local_8f8 [16];
  undefined1 local_8e8 [16];
  byte local_8d7;
  float local_8c8 [4];
  undefined1 local_8b8 [16];
  float local_8a8 [4];
  undefined1 local_898 [16];
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  RTCHitN local_868 [16];
  undefined1 local_858 [16];
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  uint local_7f8;
  uint uStack_7f4;
  uint uStack_7f0;
  uint uStack_7ec;
  uint uStack_7e8;
  uint uStack_7e4;
  uint uStack_7e0;
  uint uStack_7dc;
  NodeRef stack [244];
  
  stack[0] = root;
  auVar41 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4)));
  auVar71 = ZEXT1664(auVar41);
  auVar42 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x10)));
  auVar72 = ZEXT1664(auVar42);
  auVar43 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x20)));
  auVar73 = ZEXT1664(auVar43);
  auVar41 = vmulss_avx512f(auVar41,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  uVar26 = auVar41._0_4_;
  auVar41 = vmulss_avx512f(auVar42,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar42 = vmulss_avx512f(auVar43,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  uVar64 = auVar41._0_4_;
  uVar65 = auVar42._0_4_;
  uVar29 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar24 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar40 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar25 = uVar29 ^ 0x10;
  auVar41 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar74 = ZEXT1664(auVar41);
  auVar41 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tfar).field_0.i[k]));
  auVar75 = ZEXT1664(auVar41);
  auVar42._0_8_ = CONCAT44(uVar26,uVar26) ^ 0x8000000080000000;
  auVar42._8_4_ = uVar26 ^ 0x80000000;
  auVar42._12_4_ = uVar26 ^ 0x80000000;
  auVar43._0_8_ = CONCAT44(uVar64,uVar64) ^ 0x8000000080000000;
  auVar43._8_4_ = uVar64 ^ 0x80000000;
  auVar43._12_4_ = uVar64 ^ 0x80000000;
  auVar70._0_8_ = CONCAT44(uVar65,uVar65) ^ 0x8000000080000000;
  auVar70._8_4_ = uVar65 ^ 0x80000000;
  auVar70._12_4_ = uVar65 ^ 0x80000000;
  auVar41 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  pNVar20 = stack + 1;
  local_9b8 = uVar29;
LAB_01cbeddb:
  do {
    local_9c8 = pNVar20;
    if (local_9c8 == stack) {
LAB_01cbf79c:
      return local_9c8 != stack;
    }
    local_a78 = local_9c8 + -1;
    sVar39 = local_9c8[-1].ptr;
    while ((sVar39 & 8) == 0) {
      uVar21 = sVar39 & 0xfffffffffffffff0;
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x70);
      auVar58._4_4_ = uVar2;
      auVar58._0_4_ = uVar2;
      auVar58._8_4_ = uVar2;
      auVar58._12_4_ = uVar2;
      auVar46 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0x80 + uVar29),auVar58,
                                *(undefined1 (*) [16])(uVar21 + 0x20 + uVar29));
      auVar44 = vfmadd213ps_avx512vl(auVar46,auVar71._0_16_,auVar42);
      auVar46 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0x80 + uVar24),auVar58,
                                *(undefined1 (*) [16])(uVar21 + 0x20 + uVar24));
      auVar45 = vmaxps_avx512vl(auVar74._0_16_,auVar44);
      auVar44 = vfmadd213ps_avx512vl(auVar46,auVar72._0_16_,auVar43);
      auVar46 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0x80 + uVar40),auVar58,
                                *(undefined1 (*) [16])(uVar21 + 0x20 + uVar40));
      auVar46 = vfmadd213ps_avx512vl(auVar46,auVar73._0_16_,auVar70);
      auVar46 = vmaxps_avx(auVar44,auVar46);
      auVar44 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0x80 + uVar25),auVar58,
                                *(undefined1 (*) [16])(uVar21 + 0x20 + uVar25));
      auVar46 = vmaxps_avx(auVar45,auVar46);
      auVar45 = vfmadd213ps_avx512vl(auVar44,auVar71._0_16_,auVar42);
      auVar44 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0x80 + (uVar24 ^ 0x10)),auVar58,
                                *(undefined1 (*) [16])(uVar21 + 0x20 + (uVar24 ^ 0x10)));
      auVar45 = vminps_avx512vl(auVar75._0_16_,auVar45);
      auVar47 = vfmadd213ps_avx512vl(auVar44,auVar72._0_16_,auVar43);
      auVar44 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0x80 + (uVar40 ^ 0x10)),auVar58,
                                *(undefined1 (*) [16])(uVar21 + 0x20 + (uVar40 ^ 0x10)));
      auVar44 = vfmadd213ps_avx512vl(auVar44,auVar73._0_16_,auVar70);
      auVar44 = vminps_avx(auVar47,auVar44);
      auVar44 = vminps_avx(auVar45,auVar44);
      uVar16 = vcmpps_avx512vl(auVar46,auVar44,2);
      uVar26 = (uint)uVar16;
      if (((uint)sVar39 & 7) == 6) {
        uVar17 = vcmpps_avx512vl(auVar58,*(undefined1 (*) [16])(uVar21 + 0xf0),1);
        uVar18 = vcmpps_avx512vl(auVar58,*(undefined1 (*) [16])(uVar21 + 0xe0),0xd);
        uVar26 = (uint)(byte)((byte)uVar17 & (byte)uVar18 & (byte)uVar16);
      }
      pNVar20 = local_a78;
      if ((byte)uVar26 == 0) goto LAB_01cbeddb;
      lVar23 = 0;
      for (uVar27 = (ulong)(byte)uVar26; (uVar27 & 1) == 0;
          uVar27 = uVar27 >> 1 | 0x8000000000000000) {
        lVar23 = lVar23 + 1;
      }
      sVar39 = *(size_t *)(uVar21 + lVar23 * 8);
      uVar26 = (uVar26 & 0xff) - 1 & uVar26 & 0xff;
      uVar27 = (ulong)uVar26;
      if (uVar26 != 0) {
        do {
          local_a78->ptr = sVar39;
          local_a78 = local_a78 + 1;
          lVar23 = 0;
          for (uVar30 = uVar27; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
            lVar23 = lVar23 + 1;
          }
          uVar27 = uVar27 - 1 & uVar27;
          sVar39 = *(size_t *)(uVar21 + lVar23 * 8);
        } while (uVar27 != 0);
      }
    }
    local_9b0 = (ulong)((uint)sVar39 & 0xf) - 8;
    uVar21 = sVar39 & 0xfffffffffffffff0;
    for (lVar23 = 0; pNVar20 = local_a78, lVar23 != local_9b0; lVar23 = lVar23 + 1) {
      lVar28 = lVar23 * 0x50;
      scene = context->scene;
      pGVar9 = (scene->geometries).items[*(uint *)(uVar21 + 0x30 + lVar28)].ptr;
      fVar3 = (pGVar9->time_range).lower;
      fVar3 = pGVar9->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0x70) - fVar3) / ((pGVar9->time_range).upper - fVar3));
      auVar46 = vroundss_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),9);
      auVar46 = vminss_avx(auVar46,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
      auVar13 = vmaxss_avx(ZEXT816(0) << 0x20,auVar46);
      lVar22 = (long)(int)auVar13._0_4_ * 0x38;
      lVar10 = *(long *)(*(long *)&pGVar9[2].numPrimitives + lVar22);
      auVar46 = *(undefined1 (*) [16])(lVar10 + (ulong)*(uint *)(uVar21 + lVar28) * 4);
      uVar30 = (ulong)*(uint *)(uVar21 + 0x10 + lVar28);
      auVar44 = *(undefined1 (*) [16])(lVar10 + uVar30 * 4);
      uVar31 = (ulong)*(uint *)(uVar21 + 0x20 + lVar28);
      auVar45 = *(undefined1 (*) [16])(lVar10 + uVar31 * 4);
      uVar32 = (ulong)*(uint *)(uVar21 + 4 + lVar28);
      auVar47 = *(undefined1 (*) [16])(lVar10 + uVar32 * 4);
      uVar33 = (ulong)*(uint *)(uVar21 + 0x14 + lVar28);
      auVar58 = *(undefined1 (*) [16])(lVar10 + uVar33 * 4);
      uVar34 = (ulong)*(uint *)(uVar21 + 0x24 + lVar28);
      auVar60 = *(undefined1 (*) [16])(lVar10 + uVar34 * 4);
      uVar37 = (ulong)*(uint *)(uVar21 + 8 + lVar28);
      auVar48 = *(undefined1 (*) [16])(lVar10 + uVar37 * 4);
      uVar38 = (ulong)*(uint *)(uVar21 + 0x18 + lVar28);
      auVar50 = *(undefined1 (*) [16])(lVar10 + uVar38 * 4);
      uVar36 = (ulong)*(uint *)(uVar21 + 0x28 + lVar28);
      auVar61 = *(undefined1 (*) [16])(lVar10 + uVar36 * 4);
      uVar35 = (ulong)*(uint *)(uVar21 + 0xc + lVar28);
      auVar62 = *(undefined1 (*) [16])(lVar10 + uVar35 * 4);
      uVar29 = (ulong)*(uint *)(uVar21 + 0x1c + lVar28);
      auVar59 = *(undefined1 (*) [16])(lVar10 + uVar29 * 4);
      lVar22 = *(long *)(*(long *)&pGVar9[2].numPrimitives + 0x38 + lVar22);
      uVar27 = (ulong)*(uint *)(uVar21 + 0x2c + lVar28);
      auVar49 = *(undefined1 (*) [16])(lVar10 + uVar27 * 4);
      auVar51 = *(undefined1 (*) [16])(lVar22 + (ulong)*(uint *)(uVar21 + lVar28) * 4);
      auVar52 = *(undefined1 (*) [16])(lVar22 + uVar30 * 4);
      auVar55 = *(undefined1 (*) [16])(lVar22 + uVar31 * 4);
      auVar53 = *(undefined1 (*) [16])(lVar22 + uVar32 * 4);
      auVar54 = *(undefined1 (*) [16])(lVar22 + uVar33 * 4);
      auVar56 = *(undefined1 (*) [16])(lVar22 + uVar34 * 4);
      auVar57 = *(undefined1 (*) [16])(lVar22 + uVar37 * 4);
      auVar63 = *(undefined1 (*) [16])(lVar22 + uVar38 * 4);
      auVar5 = *(undefined1 (*) [16])(lVar22 + uVar36 * 4);
      auVar6 = *(undefined1 (*) [16])(lVar22 + uVar35 * 4);
      auVar7 = *(undefined1 (*) [16])(lVar22 + uVar29 * 4);
      auVar8 = *(undefined1 (*) [16])(lVar22 + uVar27 * 4);
      puVar1 = (undefined8 *)(uVar21 + 0x30 + lVar28);
      local_928 = *puVar1;
      uStack_920 = puVar1[1];
      puVar1 = (undefined8 *)(uVar21 + 0x40 + lVar28);
      auVar14 = vunpcklps_avx(auVar46,auVar48);
      auVar46 = vunpckhps_avx(auVar46,auVar48);
      auVar48 = vunpcklps_avx(auVar47,auVar62);
      auVar47 = vunpckhps_avx(auVar47,auVar62);
      auVar62 = vunpcklps_avx(auVar46,auVar47);
      auVar15 = vunpcklps_avx(auVar14,auVar48);
      auVar46 = vunpckhps_avx(auVar14,auVar48);
      auVar48 = vunpcklps_avx(auVar44,auVar50);
      auVar44 = vunpckhps_avx(auVar44,auVar50);
      auVar50 = vunpcklps_avx(auVar58,auVar59);
      auVar47 = vunpckhps_avx(auVar58,auVar59);
      auVar58 = vunpcklps_avx(auVar44,auVar47);
      auVar59 = vunpcklps_avx(auVar48,auVar50);
      auVar44 = vunpckhps_avx(auVar48,auVar50);
      auVar48 = vunpcklps_avx(auVar45,auVar61);
      auVar45 = vunpckhps_avx(auVar45,auVar61);
      auVar50 = vunpcklps_avx(auVar60,auVar49);
      auVar47 = vunpckhps_avx(auVar60,auVar49);
      auVar60 = vunpcklps_avx(auVar45,auVar47);
      auVar61 = vunpcklps_avx(auVar48,auVar50);
      auVar45 = vunpckhps_avx(auVar48,auVar50);
      auVar47 = vunpcklps_avx512vl(auVar51,auVar57);
      auVar48 = vunpckhps_avx512vl(auVar51,auVar57);
      auVar49 = vunpcklps_avx512vl(auVar53,auVar6);
      auVar50 = vunpckhps_avx512vl(auVar53,auVar6);
      auVar48 = vunpcklps_avx(auVar48,auVar50);
      auVar50 = vunpcklps_avx(auVar47,auVar49);
      auVar47 = vunpckhps_avx(auVar47,auVar49);
      auVar49 = vunpcklps_avx512vl(auVar52,auVar63);
      auVar51 = vunpckhps_avx512vl(auVar52,auVar63);
      auVar52 = vunpcklps_avx512vl(auVar54,auVar7);
      auVar53 = vunpckhps_avx512vl(auVar54,auVar7);
      auVar51 = vunpcklps_avx512vl(auVar51,auVar53);
      auVar53 = vunpcklps_avx512vl(auVar49,auVar52);
      auVar52 = vunpckhps_avx512vl(auVar49,auVar52);
      auVar54 = vunpcklps_avx512vl(auVar55,auVar5);
      auVar49 = vunpckhps_avx512vl(auVar55,auVar5);
      auVar55 = vunpcklps_avx512vl(auVar56,auVar8);
      auVar56 = vunpckhps_avx512vl(auVar56,auVar8);
      auVar49 = vunpcklps_avx(auVar49,auVar56);
      auVar56 = vunpcklps_avx512vl(auVar54,auVar55);
      auVar55 = vunpckhps_avx512vl(auVar54,auVar55);
      auVar57 = ZEXT416((uint)(fVar3 - auVar13._0_4_));
      auVar54 = vbroadcastss_avx512vl(auVar57);
      auVar57 = vsubss_avx512f(ZEXT416(0x3f800000),auVar57);
      auVar63._0_4_ = auVar57._0_4_;
      auVar63._4_4_ = auVar63._0_4_;
      auVar63._8_4_ = auVar63._0_4_;
      auVar63._12_4_ = auVar63._0_4_;
      auVar50 = vmulps_avx512vl(auVar54,auVar50);
      auVar47 = vmulps_avx512vl(auVar54,auVar47);
      auVar57 = vmulps_avx512vl(auVar54,auVar48);
      auVar48 = vfmadd231ps_fma(auVar50,auVar63,auVar15);
      auVar50 = vfmadd231ps_fma(auVar47,auVar63,auVar46);
      auVar62 = vfmadd231ps_fma(auVar57,auVar63,auVar62);
      auVar46 = vmulps_avx512vl(auVar54,auVar53);
      auVar47 = vmulps_avx512vl(auVar54,auVar52);
      auVar51 = vmulps_avx512vl(auVar54,auVar51);
      auVar46 = vfmadd231ps_fma(auVar46,auVar63,auVar59);
      auVar44 = vfmadd231ps_fma(auVar47,auVar63,auVar44);
      auVar47 = vfmadd231ps_fma(auVar51,auVar63,auVar58);
      auVar58 = vmulps_avx512vl(auVar54,auVar56);
      auVar59 = vmulps_avx512vl(auVar54,auVar55);
      auVar49 = vmulps_avx512vl(auVar54,auVar49);
      auVar58 = vfmadd231ps_fma(auVar58,auVar63,auVar61);
      auVar61 = vfmadd231ps_fma(auVar59,auVar63,auVar45);
      auVar60 = vfmadd231ps_fma(auVar49,auVar63,auVar60);
      local_938 = *puVar1;
      uStack_930 = puVar1[1];
      auVar46 = vsubps_avx(auVar48,auVar46);
      auVar44 = vsubps_avx(auVar50,auVar44);
      auVar45 = vsubps_avx(auVar62,auVar47);
      auVar47 = vsubps_avx(auVar58,auVar48);
      auVar58 = vsubps_avx(auVar61,auVar50);
      auVar59 = vsubps_avx512vl(auVar60,auVar62);
      auVar60 = vmulps_avx512vl(auVar44,auVar59);
      local_898 = vfmsub231ps_fma(auVar60,auVar58,auVar45);
      auVar49._0_4_ = auVar45._0_4_ * auVar47._0_4_;
      auVar49._4_4_ = auVar45._4_4_ * auVar47._4_4_;
      auVar49._8_4_ = auVar45._8_4_ * auVar47._8_4_;
      auVar49._12_4_ = auVar45._12_4_ * auVar47._12_4_;
      local_888 = vfmsub231ps_avx512vl(auVar49,auVar59,auVar46);
      auVar51._0_4_ = auVar46._0_4_ * auVar58._0_4_;
      auVar51._4_4_ = auVar46._4_4_ * auVar58._4_4_;
      auVar51._8_4_ = auVar46._8_4_ * auVar58._8_4_;
      auVar51._12_4_ = auVar46._12_4_ * auVar58._12_4_;
      fVar3 = *(float *)(ray + k * 4 + 0x40);
      auVar55._4_4_ = fVar3;
      auVar55._0_4_ = fVar3;
      auVar55._8_4_ = fVar3;
      auVar55._12_4_ = fVar3;
      fVar66 = *(float *)(ray + k * 4 + 0x50);
      auVar53._4_4_ = fVar66;
      auVar53._0_4_ = fVar66;
      auVar53._8_4_ = fVar66;
      auVar53._12_4_ = fVar66;
      auVar61 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
      uVar2 = *(undefined4 *)(ray + k * 4);
      auVar60._4_4_ = uVar2;
      auVar60._0_4_ = uVar2;
      auVar60._8_4_ = uVar2;
      auVar60._12_4_ = uVar2;
      auVar49 = vsubps_avx512vl(auVar48,auVar60);
      local_878 = vfmsub231ps_fma(auVar51,auVar47,auVar44);
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar48._4_4_ = uVar2;
      auVar48._0_4_ = uVar2;
      auVar48._8_4_ = uVar2;
      auVar48._12_4_ = uVar2;
      auVar51 = vsubps_avx512vl(auVar50,auVar48);
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar50._4_4_ = uVar2;
      auVar50._0_4_ = uVar2;
      auVar50._8_4_ = uVar2;
      auVar50._12_4_ = uVar2;
      auVar50 = vsubps_avx512vl(auVar62,auVar50);
      auVar52._0_4_ = fVar66 * auVar50._0_4_;
      auVar52._4_4_ = fVar66 * auVar50._4_4_;
      auVar52._8_4_ = fVar66 * auVar50._8_4_;
      auVar52._12_4_ = fVar66 * auVar50._12_4_;
      auVar52 = vfmsub231ps_avx512vl(auVar52,auVar51,auVar61);
      auVar60 = vmulps_avx512vl(auVar61,auVar49);
      auVar60 = vfmsub231ps_fma(auVar60,auVar50,auVar55);
      auVar54._0_4_ = fVar3 * auVar51._0_4_;
      auVar54._4_4_ = fVar3 * auVar51._4_4_;
      auVar54._8_4_ = fVar3 * auVar51._8_4_;
      auVar54._12_4_ = fVar3 * auVar51._12_4_;
      auVar48 = vfmsub231ps_fma(auVar54,auVar49,auVar53);
      auVar61 = vmulps_avx512vl(local_878,auVar61);
      auVar61 = vfmadd231ps_avx512vl(auVar61,local_888,auVar53);
      auVar55 = vfmadd231ps_avx512vl(auVar61,local_898,auVar55);
      auVar61._8_4_ = 0x7fffffff;
      auVar61._0_8_ = 0x7fffffff7fffffff;
      auVar61._12_4_ = 0x7fffffff;
      local_8e8 = vandps_avx512vl(auVar55,auVar61);
      auVar62._8_4_ = 0x80000000;
      auVar62._0_8_ = 0x8000000080000000;
      auVar62._12_4_ = 0x80000000;
      auVar61 = vandps_avx512vl(auVar55,auVar62);
      auVar62 = vmulps_avx512vl(auVar59,auVar48);
      auVar58 = vfmadd231ps_avx512vl(auVar62,auVar60,auVar58);
      auVar47 = vfmadd231ps_avx512vl(auVar58,auVar52,auVar47);
      local_918 = vxorps_avx512vl(auVar61,auVar47);
      auVar47._0_4_ = auVar45._0_4_ * auVar48._0_4_;
      auVar47._4_4_ = auVar45._4_4_ * auVar48._4_4_;
      auVar47._8_4_ = auVar45._8_4_ * auVar48._8_4_;
      auVar47._12_4_ = auVar45._12_4_ * auVar48._12_4_;
      auVar44 = vfmadd231ps_fma(auVar47,auVar44,auVar60);
      auVar46 = vfmadd231ps_fma(auVar44,auVar46,auVar52);
      local_908._0_4_ = (float)(auVar61._0_4_ ^ auVar46._0_4_);
      local_908._4_4_ = (float)(auVar61._4_4_ ^ auVar46._4_4_);
      local_908._8_4_ = (float)(auVar61._8_4_ ^ auVar46._8_4_);
      local_908._12_4_ = (float)(auVar61._12_4_ ^ auVar46._12_4_);
      auVar46 = ZEXT816(0) << 0x20;
      uVar16 = vcmpps_avx512vl(local_918,auVar46,5);
      uVar17 = vcmpps_avx512vl(local_908,auVar46,5);
      uVar18 = vcmpps_avx512vl(auVar55,auVar46,4);
      auVar46._0_4_ = local_918._0_4_ + local_908._0_4_;
      auVar46._4_4_ = local_918._4_4_ + local_908._4_4_;
      auVar46._8_4_ = local_918._8_4_ + local_908._8_4_;
      auVar46._12_4_ = local_918._12_4_ + local_908._12_4_;
      uVar19 = vcmpps_avx512vl(auVar46,local_8e8,2);
      local_8d7 = (byte)uVar16 & (byte)uVar17 & (byte)uVar18 & (byte)uVar19;
      if (local_8d7 != 0) {
        auVar45._0_4_ = auVar50._0_4_ * local_878._0_4_;
        auVar45._4_4_ = auVar50._4_4_ * local_878._4_4_;
        auVar45._8_4_ = auVar50._8_4_ * local_878._8_4_;
        auVar45._12_4_ = auVar50._12_4_ * local_878._12_4_;
        auVar46 = vfmadd213ps_fma(auVar51,local_888,auVar45);
        auVar46 = vfmadd213ps_fma(auVar49,local_898,auVar46);
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x30);
        auVar44._4_4_ = uVar2;
        auVar44._0_4_ = uVar2;
        auVar44._8_4_ = uVar2;
        auVar44._12_4_ = uVar2;
        auVar44 = vmulps_avx512vl(local_8e8,auVar44);
        fVar3 = *(float *)(ray + k * 4 + 0x80);
        local_8f8._0_4_ = (float)(auVar61._0_4_ ^ auVar46._0_4_);
        local_8f8._4_4_ = (float)(auVar61._4_4_ ^ auVar46._4_4_);
        local_8f8._8_4_ = (float)(auVar61._8_4_ ^ auVar46._8_4_);
        local_8f8._12_4_ = (float)(auVar61._12_4_ ^ auVar46._12_4_);
        auVar59._0_4_ = fVar3 * local_8e8._0_4_;
        auVar59._4_4_ = fVar3 * local_8e8._4_4_;
        auVar59._8_4_ = fVar3 * local_8e8._8_4_;
        auVar59._12_4_ = fVar3 * local_8e8._12_4_;
        uVar16 = vcmpps_avx512vl(local_8f8,auVar59,2);
        uVar17 = vcmpps_avx512vl(auVar44,local_8f8,1);
        local_8d7 = (byte)uVar16 & (byte)uVar17 & local_8d7;
        if (local_8d7 != 0) {
          auVar46 = vrcp14ps_avx512vl(local_8e8);
          auVar56._8_4_ = 0x3f800000;
          auVar56._0_8_ = 0x3f8000003f800000;
          auVar56._12_4_ = 0x3f800000;
          auVar44 = vfnmadd213ps_avx512vl(local_8e8,auVar46,auVar56);
          auVar46 = vfmadd132ps_fma(auVar44,auVar46,auVar46);
          fVar66 = auVar46._0_4_;
          fVar67 = auVar46._4_4_;
          fVar68 = auVar46._8_4_;
          fVar69 = auVar46._12_4_;
          local_8a8[0] = fVar66 * local_8f8._0_4_;
          local_8a8[1] = fVar67 * local_8f8._4_4_;
          local_8a8[2] = fVar68 * local_8f8._8_4_;
          local_8a8[3] = fVar69 * local_8f8._12_4_;
          local_8c8[0] = fVar66 * local_918._0_4_;
          local_8c8[1] = fVar67 * local_918._4_4_;
          local_8c8[2] = fVar68 * local_918._8_4_;
          local_8c8[3] = fVar69 * local_918._12_4_;
          local_8b8._0_4_ = fVar66 * local_908._0_4_;
          local_8b8._4_4_ = fVar67 * local_908._4_4_;
          local_8b8._8_4_ = fVar68 * local_908._8_4_;
          local_8b8._12_4_ = fVar69 * local_908._12_4_;
          local_9d0 = (ulong)local_8d7;
          do {
            local_9d8 = 0;
            for (uVar29 = local_9d0; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
              local_9d8 = local_9d8 + 1;
            }
            local_9e0 = (scene->geometries).items[*(uint *)((long)&local_928 + local_9d8 * 4)].ptr;
            if ((local_9e0->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              local_9d0 = local_9d0 ^ 1L << (local_9d8 & 0x3f);
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (local_9e0->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_01cbf788:
                *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                goto LAB_01cbf79c;
              }
              uVar29 = (ulong)(uint)((int)local_9d8 * 4);
              uVar2 = *(undefined4 *)((long)local_8c8 + uVar29);
              local_838._4_4_ = uVar2;
              local_838._0_4_ = uVar2;
              local_838._8_4_ = uVar2;
              local_838._12_4_ = uVar2;
              uVar2 = *(undefined4 *)(local_8b8 + uVar29);
              local_828._4_4_ = uVar2;
              local_828._0_4_ = uVar2;
              local_828._8_4_ = uVar2;
              local_828._12_4_ = uVar2;
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)((long)local_8a8 + uVar29);
              args.context = context->user;
              local_808 = vpbroadcastd_avx512vl();
              uVar2 = *(undefined4 *)((long)&local_938 + uVar29);
              local_818._4_4_ = uVar2;
              local_818._0_4_ = uVar2;
              local_818._8_4_ = uVar2;
              local_818._12_4_ = uVar2;
              uVar2 = *(undefined4 *)(local_898 + uVar29);
              uVar4 = *(undefined4 *)(local_888 + uVar29);
              local_858._4_4_ = uVar4;
              local_858._0_4_ = uVar4;
              local_858._8_4_ = uVar4;
              local_858._12_4_ = uVar4;
              uVar4 = *(undefined4 *)(local_878 + uVar29);
              local_848._4_4_ = uVar4;
              local_848._0_4_ = uVar4;
              local_848._8_4_ = uVar4;
              local_848._12_4_ = uVar4;
              local_868[0] = (RTCHitN)(char)uVar2;
              local_868[1] = (RTCHitN)(char)((uint)uVar2 >> 8);
              local_868[2] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
              local_868[3] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
              local_868[4] = (RTCHitN)(char)uVar2;
              local_868[5] = (RTCHitN)(char)((uint)uVar2 >> 8);
              local_868[6] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
              local_868[7] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
              local_868[8] = (RTCHitN)(char)uVar2;
              local_868[9] = (RTCHitN)(char)((uint)uVar2 >> 8);
              local_868[10] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
              local_868[0xb] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
              local_868[0xc] = (RTCHitN)(char)uVar2;
              local_868[0xd] = (RTCHitN)(char)((uint)uVar2 >> 8);
              local_868[0xe] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
              local_868[0xf] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
              vpcmpeqd_avx2(ZEXT1632(local_808),ZEXT1632(local_808));
              uStack_7f4 = (args.context)->instID[0];
              local_7f8 = uStack_7f4;
              uStack_7f0 = uStack_7f4;
              uStack_7ec = uStack_7f4;
              uStack_7e8 = (args.context)->instPrimID[0];
              uStack_7e4 = uStack_7e8;
              uStack_7e0 = uStack_7e8;
              uStack_7dc = uStack_7e8;
              args.valid = (int *)local_9f8;
              args.geometryUserPtr = local_9e0->userPtr;
              args.hit = local_868;
              args.N = 4;
              local_9f8 = auVar41;
              args.ray = (RTCRayN *)ray;
              if (local_9e0->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*local_9e0->occlusionFilterN)(&args);
              }
              uVar29 = vptestmd_avx512vl(local_9f8,local_9f8);
              if ((uVar29 & 0xf) != 0) {
                p_Var11 = context->args->filter;
                if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((local_9e0->field_8).field_0x2 & 0x40) != 0)
                    ))) {
                  (*p_Var11)(&args);
                }
                uVar29 = vptestmd_avx512vl(local_9f8,local_9f8);
                uVar29 = uVar29 & 0xf;
                auVar46 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar12 = (bool)((byte)uVar29 & 1);
                auVar57._0_4_ =
                     (uint)bVar12 * auVar46._0_4_ | (uint)!bVar12 * *(int *)(args.ray + 0x80);
                bVar12 = (bool)((byte)(uVar29 >> 1) & 1);
                auVar57._4_4_ =
                     (uint)bVar12 * auVar46._4_4_ | (uint)!bVar12 * *(int *)(args.ray + 0x84);
                bVar12 = (bool)((byte)(uVar29 >> 2) & 1);
                auVar57._8_4_ =
                     (uint)bVar12 * auVar46._8_4_ | (uint)!bVar12 * *(int *)(args.ray + 0x88);
                bVar12 = SUB81(uVar29 >> 3,0);
                auVar57._12_4_ =
                     (uint)bVar12 * auVar46._12_4_ | (uint)!bVar12 * *(int *)(args.ray + 0x8c);
                *(undefined1 (*) [16])(args.ray + 0x80) = auVar57;
                if ((byte)uVar29 != 0) goto LAB_01cbf788;
              }
              *(float *)(ray + k * 4 + 0x80) = fVar3;
              local_9d0 = local_9d0 ^ 1L << (local_9d8 & 0x3f);
              auVar71 = ZEXT1664(auVar71._0_16_);
              auVar72 = ZEXT1664(auVar72._0_16_);
              auVar73 = ZEXT1664(auVar73._0_16_);
              auVar74 = ZEXT1664(auVar74._0_16_);
              auVar75 = ZEXT1664(auVar75._0_16_);
            }
          } while (local_9d0 != 0);
        }
      }
      uVar29 = local_9b8;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }